

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int MD5_Update(MD5_CTX *c,void *data,size_t len)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  uint local_24;
  uint partLen;
  uint bufindex;
  uint i;
  uint inputLen_local;
  uchar *input_local;
  md5_ctx *context_local;
  
  uVar3 = (uint)len;
  local_24 = c->Nl >> 3 & 0x3f;
  uVar1 = uVar3 * 8 + c->Nl;
  c->Nl = uVar1;
  if (uVar1 < uVar3 << 3) {
    c->Nh = c->Nh + 1;
  }
  c->Nh = (uVar3 >> 0x1d) + c->Nh;
  partLen = 0x40 - local_24;
  if (uVar3 < partLen) {
    partLen = 0;
  }
  else {
    memcpy((void *)((long)c->data + (ulong)local_24),data,(ulong)partLen);
    MD5Transform(&c->A,(uchar *)c->data);
    for (; partLen + 0x3f < uVar3; partLen = partLen + 0x40) {
      MD5Transform(&c->A,(uchar *)((long)data + (ulong)partLen));
    }
    local_24 = 0;
  }
  pvVar2 = memcpy((void *)((long)c->data + (ulong)local_24),(void *)((long)data + (ulong)partLen),
                  (ulong)(uVar3 - partLen));
  return (int)pvVar2;
}

Assistant:

static void MD5_Update (struct md5_ctx *context,    /* context */
                        const unsigned char *input, /* input block */
                        unsigned int inputLen)      /* length of input block */
{
  unsigned int i, bufindex, partLen;

  /* Compute number of bytes mod 64 */
  bufindex = (unsigned int)((context->count[0] >> 3) & 0x3F);

  /* Update number of bits */
  if((context->count[0] += ((UINT4)inputLen << 3))
      < ((UINT4)inputLen << 3))
    context->count[1]++;
  context->count[1] += ((UINT4)inputLen >> 29);

  partLen = 64 - bufindex;

  /* Transform as many times as possible. */
  if(inputLen >= partLen) {
    memcpy(&context->buffer[bufindex], input, partLen);
    MD5Transform(context->state, context->buffer);

    for(i = partLen; i + 63 < inputLen; i += 64)
      MD5Transform(context->state, &input[i]);

    bufindex = 0;
  }
  else
    i = 0;

  /* Buffer remaining input */
  memcpy(&context->buffer[bufindex], &input[i], inputLen-i);
}